

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaBinrIO.cpp
# Opt level: O2

long __thiscall NaBinaryStreamFile::CountOfRecord(NaBinaryStreamFile *this)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  long __off;
  long lVar4;
  
  __off = ftell((FILE *)this->fp);
  fseek((FILE *)this->fp,0,2);
  lVar4 = ftell((FILE *)this->fp);
  lVar2 = this->oBinStream;
  iVar1 = this->nVar;
  sVar3 = this->nDataSize;
  fseek((FILE *)this->fp,__off,0);
  return (ulong)(lVar4 - lVar2) / ((long)iVar1 * sVar3);
}

Assistant:

long
NaBinaryStreamFile::CountOfRecord ()
{
  long    n, pos;

  n = 0;
  pos = ftell(fp);

  /* goto end of file */
  fseek(fp, 0, SEEK_END);
  n = (ftell(fp) - oBinStream) / (nDataSize * nVar);

  /* return to old position */
  fseek(fp, pos, SEEK_SET);

  return n;
}